

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

int ComputeQCostBits(Cube *p)

{
  varvalue vVar1;
  int iVar2;
  int iVar3;
  int Var;
  
  if (g_CoverInfo.nVarsIn < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    Var = 0;
    iVar2 = 0;
    iVar3 = 0;
    do {
      vVar1 = GetVar(p,Var);
      if (vVar1 == VAR_POS) {
        iVar3 = iVar3 + 1;
      }
      else if (vVar1 == VAR_NEG) {
        iVar2 = iVar2 + 1;
      }
      Var = Var + 1;
    } while (Var < g_CoverInfo.nVarsIn);
  }
  iVar2 = GetQCost(iVar3 + iVar2,iVar2);
  return iVar2;
}

Assistant:

int ComputeQCostBits( Cube * p )
{
    extern varvalue GetVar( Cube* pC, int Var );
    int v, nLits = 0, nLitsN = 0;
    for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
    {
        int Value = GetVar( p, v );
        if ( Value == VAR_NEG )
            nLitsN++;
        else if ( Value == VAR_POS )
            nLits++;
    }
    nLits += nLitsN;
    return GetQCost( nLits, nLitsN );
}